

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_tls_id(uint16_t tls_id)

{
  mbedtls_ecp_curve_info *local_20;
  mbedtls_ecp_curve_info *curve_info;
  uint16_t tls_id_local;
  
  local_20 = mbedtls_ecp_curve_list();
  while( true ) {
    if (local_20->grp_id == MBEDTLS_ECP_DP_NONE) {
      return (mbedtls_ecp_curve_info *)0x0;
    }
    if (local_20->tls_id == tls_id) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_tls_id( uint16_t tls_id )
{
    const mbedtls_ecp_curve_info *curve_info;

    for( curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++ )
    {
        if( curve_info->tls_id == tls_id )
            return( curve_info );
    }

    return( NULL );
}